

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray-png.cxx
# Opt level: O1

void testSaveLoad<(andres::CoordinateOrder)0,(andres::CoordinateOrder)1>(void)

{
  reference puVar1;
  size_t sVar2;
  logic_error *plVar3;
  code *pcVar4;
  undefined *puVar5;
  Marray<unsigned_char,_std::allocator<unsigned_long>_> m;
  size_t shape [2];
  string fileName;
  allocator_type local_96;
  uchar local_95;
  CoordinateOrder local_94;
  Marray<unsigned_char,_std::allocator<unsigned_long>_> local_90;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  string local_38;
  
  local_48 = 2;
  uStack_44 = 0;
  uStack_40 = 3;
  uStack_3c = 0;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"test.png","");
  local_95 = '\0';
  local_94 = FirstMajorOrder;
  andres::Marray<unsigned_char,std::allocator<unsigned_long>>::Marray<unsigned_long_const*>
            ((Marray<unsigned_char,std::allocator<unsigned_long>> *)&local_90,
             (unsigned_long *)&local_48,(unsigned_long *)&local_38,&local_95,&local_94,&local_96);
  puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)&local_90,0,0);
  *puVar1 = '\x7f';
  puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)&local_90,0,2);
  *puVar1 = 0xff;
  puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)&local_90,1,0);
  *puVar1 = 200;
  andres::png::save<unsigned_char>(&local_38,&local_90);
  operator_delete(local_90.super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>.data_,
                  local_90.super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>.
                  geometry_.size_);
  operator_delete(local_90.super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>.
                  geometry_.shape_,
                  local_90.super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>.
                  geometry_.dimension_ * 0x18);
  local_95 = '\0';
  local_94 = LastMajorOrder;
  andres::Marray<unsigned_char,_std::allocator<unsigned_long>_>::Marray
            (&local_90,&local_95,&local_94,&local_96);
  andres::png::load<unsigned_char>(&local_38,&local_90);
  andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
            (&local_90.super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
  if (local_90.super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>.geometry_.
      coordinateOrder_ != LastMajorOrder) {
    plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar3,"test failed.");
    __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if (local_90.super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>.data_ ==
      (pointer)0x0) {
    plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar3,"Assertion failed.");
    pcVar4 = std::runtime_error::~runtime_error;
    puVar5 = &std::runtime_error::typeinfo;
  }
  else {
    if (local_90.super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>.geometry_.
        dimension_ == 2) {
      sVar2 = andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                        (&local_90.super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>,
                         0);
      if (sVar2 != CONCAT44(uStack_44,local_48)) {
        plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar3,"test failed.");
        __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar2 = andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                        (&local_90.super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>,
                         1);
      if (sVar2 != CONCAT44(uStack_3c,uStack_40)) {
        plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar3,"test failed.");
        __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                         ((View<unsigned_char,false,std::allocator<unsigned_long>> *)&local_90,0,0);
      if (*puVar1 != '\x7f') {
        plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar3,"test failed.");
        __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                         ((View<unsigned_char,false,std::allocator<unsigned_long>> *)&local_90,0,2);
      if (*puVar1 == 0xff) {
        puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                           ((View<unsigned_char,false,std::allocator<unsigned_long>> *)&local_90,1,0
                           );
        if (*puVar1 == 200) {
          operator_delete(local_90.super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>.
                          data_,local_90.
                                super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>.
                                geometry_.size_);
          operator_delete(local_90.super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>.
                          geometry_.shape_,
                          local_90.super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>.
                          geometry_.dimension_ * 0x18);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_38._M_dataplus._M_p != &local_38.field_2) {
            operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
          }
          return;
        }
        plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar3,"test failed.");
        __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar3,"test failed.");
      __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar3,"test failed.");
    pcVar4 = std::logic_error::~logic_error;
    puVar5 = &std::logic_error::typeinfo;
  }
  __cxa_throw(plVar3,puVar5,pcVar4);
}

Assistant:

void testSaveLoad() {
    size_t const shape[] = {2, 3};
    std::string const fileName = "test.png";
    {
        andres::Marray<unsigned char> m(shape, shape + 2, 0, ORDER_SAVE);
        m(0, 0) = 127;
        m(0, 2) = 255;
        m(1, 0) = 200;
        andres::png::save(fileName, m);
    }
    {
        andres::Marray<unsigned char> m(0, ORDER_LOAD);
        andres::png::load(fileName, m);
        test(m.coordinateOrder() == ORDER_LOAD);
        test(m.dimension() == 2);
        test(m.shape(0) == shape[0]);
        test(m.shape(1) == shape[1]);
        test(m(0, 0) == 127);
        test(m(0, 2) == 255);
        test(m(1, 0) == 200);
    }
}